

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

void __thiscall Win32MakefileGenerator::writeRcFilePart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  ProString *pPVar3;
  undefined8 uVar4;
  bool bVar5;
  CutResult CVar6;
  ProStringList *pPVar7;
  ulong uVar8;
  QTextStream *pQVar9;
  char16_t *pcVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QStringView config;
  ProString defines;
  ProString res_file;
  QArrayData *local_210 [3];
  ProString local_1f8;
  ProKey local_1c8;
  QArrayData *local_190 [3];
  QArrayDataPointer<QString> local_178;
  QString local_158;
  QArrayDataPointer<QString> local_138;
  QArrayData *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  QArrayDataPointer<ProString> local_100;
  undefined1 local_e8 [32];
  undefined1 *puStack_c8;
  undefined1 *local_c0;
  QString local_b8;
  undefined1 local_98 [28];
  int iStack_7c;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_68,"RC_FILE");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  lVar12 = (pPVar7->super_QList<ProString>).d.size;
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (lVar12 != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_98,"RES_FILE");
    QMakeEvaluator::first((ProString *)local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_e8,"RC_FILE");
    QMakeEvaluator::first((ProString *)local_98,&pQVar1->super_QMakeEvaluator,(ProKey *)local_e8);
    ProString::toQString((QString *)&local_1c8,(ProString *)local_98);
    MakefileGenerator::fileFixify
              (&local_b8,&this->super_MakefileGenerator,(QString *)&local_1c8,(FileFixifyTypes)0x0,
               true);
    if (&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_98,"RC_INCLUDEPATH");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
    local_100.d = (pPVar7->super_QList<ProString>).d.d;
    local_100.ptr = (pPVar7->super_QList<ProString>).d.ptr;
    local_100.size = (pPVar7->super_QList<ProString>).d.size;
    if (local_100.d != (Data *)0x0) {
      LOCK();
      ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    local_118 = (QArrayData *)0x0;
    uStack_110 = 0;
    local_108 = 0;
    if (local_100.size != 0) {
      lVar12 = 0;
      uVar11 = 0;
      uVar8 = local_100.size;
      do {
        pPVar3 = local_100.ptr;
        if (*(int *)((long)&(local_100.ptr)->m_length + lVar12) != 0) {
          local_98._0_8_ = (QArrayData *)0x0;
          local_98._8_8_ = L" /i ";
          local_98._16_8_ = (undefined1 *)0x4;
          QString::append((QString *)&local_118);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
          MakefileGenerator::escapeFilePath
                    ((ProString *)local_98,&this->super_MakefileGenerator,
                     (ProString *)((long)&(pPVar3->m_string).d.d + lVar12));
          uVar4 = local_98._8_8_;
          local_e8._0_8_ = SEXT48((int)local_98._24_4_);
          local_1c8.super_ProString.m_string.d.d = (Data *)(long)iStack_7c;
          CVar6 = QtPrivate::QContainerImplHelper::mid
                            (local_98._16_8_,(qsizetype *)local_e8,(qsizetype *)&local_1c8);
          if (CVar6 == Null) {
            pcVar10 = (char16_t *)0x0;
          }
          else {
            pcVar10 = (char16_t *)((long)&((DataPointer *)uVar4)->d + local_e8._0_8_ * 2);
          }
          QString::append((QChar *)&local_118,(longlong)pcVar10);
          uVar8 = local_100.size;
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
              uVar8 = local_100.size;
            }
          }
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x30;
      } while (uVar11 < uVar8);
    }
    QMakeSourceFileInfo::addSourceFile((QMakeSourceFileInfo *)this,&local_b8,'\x01',TYPE_C);
    local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_138.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = (Data *)0x0;
    local_98._8_8_ = (QString *)0x0;
    local_98._16_8_ = 0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)local_98,0,&local_b8);
    QList<QString>::end((QList<QString> *)local_98);
    QMakeSourceFileInfo::dependencies((QStringList *)local_e8,(QMakeSourceFileInfo *)this,&local_b8)
    ;
    QList<QString>::operator+=((QList<QString> *)local_98,(QStringList *)local_e8);
    local_138.d = (Data *)local_98._0_8_;
    local_138.ptr = (QString *)local_98._8_8_;
    local_138.size = local_98._16_8_;
    if ((Data *)local_98._0_8_ != (Data *)0x0) {
      LOCK();
      (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_e8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_98);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_e8,"RC_DEFINES");
    QVar14.m_data = (storage_type *)0x3;
    QVar14.m_size = (qsizetype)&local_1c8;
    QString::fromUtf8(QVar14);
    local_1f8.m_string.d.d = local_1c8.super_ProString.m_string.d.d;
    local_1f8.m_string.d.ptr = local_1c8.super_ProString.m_string.d.ptr;
    local_1f8.m_string.d.size = local_1c8.super_ProString.m_string.d.size;
    QVar15.m_data = (storage_type *)0x3;
    QVar15.m_size = (qsizetype)&local_1c8;
    QString::fromUtf8(QVar15);
    local_158.d.d = local_1c8.super_ProString.m_string.d.d;
    local_158.d.ptr = local_1c8.super_ProString.m_string.d.ptr;
    local_158.d.size = local_1c8.super_ProString.m_string.d.size;
    pcVar13 = "";
    QVar16.m_data = (storage_type *)0x0;
    QVar16.m_size = (qsizetype)&local_1c8;
    QString::fromUtf8(QVar16);
    local_178.d = (Data *)local_1c8.super_ProString.m_string.d.d;
    local_178.ptr = (QString *)local_1c8.super_ProString.m_string.d.ptr;
    local_178.size = local_1c8.super_ProString.m_string.d.size;
    MakefileGenerator::varGlue
              ((QString *)&local_1c8,&this->super_MakefileGenerator,(ProKey *)local_e8,
               &local_1f8.m_string,&local_158,(QString *)&local_178);
    ProString::ProString((ProString *)local_98,(QString *)&local_1c8);
    if (&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_178.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_178.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    if (iStack_7c == 0) {
      ProString::ProString((ProString *)local_e8," $(DEFINES)");
      QString::operator=((QString *)local_98,(QString *)local_e8);
      unique0x100008e9 = (undefined1 *)local_e8._24_8_;
      local_78 = puStack_c8;
      puStack_70 = local_c0;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
    }
    MakefileGenerator::escapeDependencyPath
              ((ProString *)local_e8,&this->super_MakefileGenerator,(ProString *)local_68);
    pQVar9 = operator<<(t,(ProString *)local_e8);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,": ");
    MakefileGenerator::escapeDependencyPaths
              ((QStringList *)&local_178,&this->super_MakefileGenerator,(QStringList *)&local_138);
    local_1c8.super_ProString.m_string.d.d =
         (Data *)CONCAT62(local_1c8.super_ProString.m_string.d.d._2_6_,0x20);
    QtPrivate::QStringList_join((QList *)&local_158,(QChar *)&local_178,(longlong)&local_1c8);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_158);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,"\n\t");
    ProKey::ProKey(&local_1c8,"QMAKE_RC");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (local_190,this,&local_1c8);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)local_190);
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar17.m_data = (storage_type *)0x5;
    QVar17.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar17);
    pDVar2 = local_1f8.m_string.d.d;
    config.m_data = local_1f8.m_string.d.ptr;
    config.m_size = local_1f8.m_string.d.size;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if (bVar5) {
      pcVar13 = " -D_DEBUG";
    }
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,pcVar13);
    pQVar9 = operator<<(pQVar9,(ProString *)local_98);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_118);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9," -fo ");
    MakefileGenerator::escapeFilePath
              (&local_1f8,&this->super_MakefileGenerator,(ProString *)local_68);
    pQVar9 = operator<<(pQVar9,&local_1f8);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,' ');
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (local_210,this,&local_b8);
    QTextStream::operator<<(pQVar9,(QString *)local_210);
    if (local_210[0] != (QArrayData *)0x0) {
      LOCK();
      (local_210[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_210[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_210[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_210[0],2,0x10);
      }
    }
    if (&(local_1f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_1f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_1f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (local_190[0] != (QArrayData *)0x0) {
      LOCK();
      (local_190[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_190[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_190[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_190[0],2,0x10);
      }
    }
    if (&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_178);
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    pQVar9 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar9);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
    if (local_118 != (QArrayData *)0x0) {
      LOCK();
      (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_118,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_100);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::writeRcFilePart(QTextStream &t)
{
    if(!project->values("RC_FILE").isEmpty()) {
        const ProString res_file = project->first("RES_FILE");
        const QString rc_file = fileFixify(project->first("RC_FILE").toQString());

        const ProStringList rcIncPaths = project->values("RC_INCLUDEPATH");
        QString incPathStr;
        for (int i = 0; i < rcIncPaths.size(); ++i) {
            const ProString &path = rcIncPaths.at(i);
            if (path.isEmpty())
                continue;
            incPathStr += QStringLiteral(" /i ");
            incPathStr += escapeFilePath(path);
        }

        addSourceFile(rc_file, QMakeSourceFileInfo::SEEK_DEPS);
        const QStringList rcDeps = QStringList(rc_file) << dependencies(rc_file);

        // The resource tool may use defines. This might be the same defines passed in as the
        // compiler, since you may use these defines in the .rc file itself.
        // As the escape syntax for the command line defines for RC is different from that for CL,
        // we might have to set specific defines for RC.
        ProString defines = varGlue("RC_DEFINES", " -D", " -D", "");
        if (defines.isEmpty())
            defines = ProString(" $(DEFINES)");

        // Also, we need to add the _DEBUG define manually since the compiler defines this symbol
        // by itself, and we use it in the automatically created rc file when VERSION is defined
        // in the .pro file.
        t << escapeDependencyPath(res_file) << ": "
          << escapeDependencyPaths(rcDeps).join(' ') << "\n\t"
          << var("QMAKE_RC") << (project->isActiveConfig("debug") ? " -D_DEBUG" : "")
          << defines << incPathStr << " -fo " << escapeFilePath(res_file)
          << ' ' << escapeFilePath(rc_file);
        t << Qt::endl << Qt::endl;
    }
}